

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonpath_test_suite.cpp
# Opt level: O0

void jsonpath_tests(string *fpath)

{
  string *psVar1;
  byte bVar2;
  bool bVar3;
  type_conflict9 tVar4;
  _Ios_Openmode _Var5;
  ostream *poVar6;
  basic_ostream<char,_std::char_traits<char>_> *pbVar7;
  string *in_RDI;
  const_array_range_type cVar8;
  undefined1 auVar9 [16];
  AssertionHandler catchAssertionHandler_3;
  json *expected_2;
  exception *e;
  AssertionHandler catchAssertionHandler_2;
  json actual_2;
  AssertionHandler catchAssertionHandler_1;
  json *expected_1;
  json actual_1;
  result_options pflags;
  AssertionHandler catchAssertionHandler;
  json *expected;
  json actual;
  result_options rflags;
  jsonpath_expression<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
  expression;
  result_options options;
  string expr;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *test_case;
  iterator __end2;
  iterator __begin2;
  const_array_range_type *__range2;
  json *instance;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *test_group;
  iterator __end1;
  iterator __begin1;
  array_range_type *__range1;
  json tests;
  fstream is;
  undefined4 in_stack_ffffffffffffe968;
  Flags in_stack_ffffffffffffe96c;
  AssertionHandler *in_stack_ffffffffffffe970;
  StringRef *in_stack_ffffffffffffe978;
  AssertionHandler *in_stack_ffffffffffffe980;
  StringRef in_stack_ffffffffffffe988;
  ExprLhs<bool> *in_stack_ffffffffffffe998;
  AssertionHandler *in_stack_ffffffffffffe9a0;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_ffffffffffffe9a8;
  string_view_type *in_stack_ffffffffffffe9b0;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_ffffffffffffe9b8;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_ffffffffffffe9c0;
  ostream *in_stack_ffffffffffffead8;
  ostream *in_stack_ffffffffffffeae0;
  string_view_type *in_stack_ffffffffffffeb20;
  string_view_type *in_stack_ffffffffffffeb28;
  ostream *in_stack_ffffffffffffeb68;
  basic_ostream<char,_std::char_traits<char>_> *in_stack_ffffffffffffeb70;
  jsonpath_expression<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
  *in_stack_ffffffffffffeb78;
  type_conflict9 local_13d2;
  type_conflict9 local_13a9;
  basic_json_decode_options<char> *in_stack_ffffffffffffed30;
  basic_istream<char,_std::char_traits<char>_> *in_stack_ffffffffffffed38;
  SourceLineInfo local_1110;
  StringRef local_1100;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *local_e00;
  SourceLineInfo local_db8;
  StringRef local_da8;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *local_9a8;
  result_options local_98c;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *local_970;
  SourceLineInfo local_928;
  StringRef local_918;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *local_518;
  result_options local_4fc;
  undefined8 local_4e8;
  undefined8 uStack_4e0;
  undefined8 local_4d8;
  undefined1 local_4d0 [16];
  result_options local_43c;
  string local_428 [32];
  string_view_type *local_408;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *local_400;
  __normal_iterator<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
  local_3f8 [3];
  const_array_range_type local_3e0;
  range<__gnu_cxx::__normal_iterator<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>,___gnu_cxx::__normal_iterator<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>
  *local_3d0;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *local_3b8;
  reference local_3b0;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *local_3a8;
  __normal_iterator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
  local_3a0;
  array_range_type local_398;
  range<__gnu_cxx::__normal_iterator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>,___gnu_cxx::__normal_iterator<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>
  *local_388;
  undefined1 local_380 [360];
  long local_218 [66];
  string *local_8;
  
  local_8 = in_RDI;
  poVar6 = std::operator<<((ostream *)&std::cout,"Test ");
  poVar6 = std::operator<<(poVar6,local_8);
  std::operator<<(poVar6,'\n');
  psVar1 = local_8;
  _Var5 = std::operator|(_S_in,_S_out);
  std::fstream::fstream(local_218,psVar1,_Var5);
  bVar2 = std::ios::operator!((ios *)((long)local_218 + *(long *)(local_218[0] + -0x18)));
  if ((bVar2 & 1) != 0) {
    poVar6 = std::operator<<((ostream *)&std::cerr,"Cannot open ");
    poVar6 = std::operator<<(poVar6,local_8);
    std::operator<<(poVar6,"\n");
    exit(1);
  }
  memset(local_380,0,0x148);
  jsoncons::basic_json_options<char>::basic_json_options
            ((basic_json_options<char> *)in_stack_ffffffffffffe980);
  jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::parse
            (in_stack_ffffffffffffed38,in_stack_ffffffffffffed30);
  jsoncons::basic_json_options<char>::~basic_json_options
            ((basic_json_options<char> *)in_stack_ffffffffffffe970);
  local_398 = jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::
              array_range(in_stack_ffffffffffffe9c0);
  local_388 = &local_398;
  local_3a0._M_current =
       (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
       jsoncons::
       range<__gnu_cxx::__normal_iterator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>,___gnu_cxx::__normal_iterator<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>
       ::begin(local_388);
  local_3a8 = (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
              jsoncons::
              range<__gnu_cxx::__normal_iterator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>,___gnu_cxx::__normal_iterator<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>
              ::end(local_388);
  while( true ) {
    bVar3 = __gnu_cxx::operator!=
                      ((__normal_iterator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                        *)in_stack_ffffffffffffe970,
                       (__normal_iterator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                        *)CONCAT44(in_stack_ffffffffffffe96c,in_stack_ffffffffffffe968));
    if (!bVar3) break;
    local_3b0 = __gnu_cxx::
                __normal_iterator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                ::operator*(&local_3a0);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffe980,
               (char *)in_stack_ffffffffffffe978);
    local_3b8 = jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::
                operator[](in_stack_ffffffffffffe9a8,(string_view_type *)in_stack_ffffffffffffe9a0);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffe980,
               (char *)in_stack_ffffffffffffe978);
    jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::operator[]
              (in_stack_ffffffffffffe9a8,(string_view_type *)in_stack_ffffffffffffe9a0);
    cVar8 = jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::array_range
                      (in_stack_ffffffffffffe9c0);
    local_3d0 = &local_3e0;
    local_3e0 = cVar8;
    local_3f8[0]._M_current =
         (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
         jsoncons::
         range<__gnu_cxx::__normal_iterator<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>,___gnu_cxx::__normal_iterator<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>
         ::begin(local_3d0);
    local_400 = (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                jsoncons::
                range<__gnu_cxx::__normal_iterator<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>,___gnu_cxx::__normal_iterator<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>
                ::end(local_3d0);
    while( true ) {
      bVar3 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                          *)in_stack_ffffffffffffe970,
                         (__normal_iterator<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                          *)CONCAT44(in_stack_ffffffffffffe96c,in_stack_ffffffffffffe968));
      if (!bVar3) break;
      local_408 = (string_view_type *)
                  __gnu_cxx::
                  __normal_iterator<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                  ::operator*(local_3f8);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffe980,
                 (char *)in_stack_ffffffffffffe978);
      jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::operator[]
                (in_stack_ffffffffffffe9a8,(string_view_type *)in_stack_ffffffffffffe9a0);
      jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::
      as<std::__cxx11::string>
                ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe978);
      local_43c = value;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffe980,
                 (char *)in_stack_ffffffffffffe978);
      bVar3 = jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::contains
                        (in_stack_ffffffffffffe9b8,in_stack_ffffffffffffe9b0);
      local_13a9 = false;
      if (bVar3) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffe980,
                   (char *)in_stack_ffffffffffffe978);
        jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::at
                  (in_stack_ffffffffffffe9b8,in_stack_ffffffffffffe9b0);
        local_13a9 = jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::
                     as<bool>((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                              in_stack_ffffffffffffe970);
      }
      if (local_13a9 != false) {
        jsoncons::jsonpath::operator|=
                  ((result_options *)in_stack_ffffffffffffe970,in_stack_ffffffffffffe96c);
      }
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffe980,
                 (char *)in_stack_ffffffffffffe978);
      bVar3 = jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::contains
                        (in_stack_ffffffffffffe9b8,in_stack_ffffffffffffe9b0);
      local_13d2 = false;
      if (bVar3) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffe980,
                   (char *)in_stack_ffffffffffffe978);
        jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::at
                  (in_stack_ffffffffffffe9b8,in_stack_ffffffffffffe9b0);
        local_13d2 = jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::
                     as<bool>((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                              in_stack_ffffffffffffe970);
      }
      if (local_13d2 != false) {
        jsoncons::jsonpath::operator|=
                  ((result_options *)in_stack_ffffffffffffe970,in_stack_ffffffffffffe96c);
      }
      auVar9 = std::__cxx11::string::operator_cast_to_basic_string_view(local_428);
      local_4e8 = 0;
      uStack_4e0 = 0;
      local_4d8 = 0;
      local_4d0 = auVar9;
      jsoncons::jsonpath::
      custom_functions<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
      ::custom_functions((custom_functions<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                          *)0x70d57a);
      jsoncons::jsonpath::
      make_expression<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
                (in_stack_ffffffffffffeb28,
                 (custom_functions<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                  *)in_stack_ffffffffffffeb20);
      jsoncons::jsonpath::
      custom_functions<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
      ::~custom_functions((custom_functions<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                           *)0x70d5a6);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffe980,
                 (char *)in_stack_ffffffffffffe978);
      bVar3 = jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::contains
                        (in_stack_ffffffffffffe9b8,in_stack_ffffffffffffe9b0);
      if (bVar3) {
        local_4fc = jsoncons::jsonpath::operator|(local_43c,value);
        jsoncons::jsonpath::
        jsonpath_expression<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
        ::evaluate(in_stack_ffffffffffffeb78,(const_reference)in_stack_ffffffffffffeb70,
                   (result_options)((ulong)in_stack_ffffffffffffeb68 >> 0x20));
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffe980,
                   (char *)in_stack_ffffffffffffe978);
        local_518 = jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::
                    operator[](in_stack_ffffffffffffe9a8,
                               (string_view_type *)in_stack_ffffffffffffe9a0);
        tVar4 = jsoncons::operator!=
                          ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                           in_stack_ffffffffffffe970,
                           (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                           CONCAT44(in_stack_ffffffffffffe96c,in_stack_ffffffffffffe968));
        if (tVar4) {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffe980,
                     (char *)in_stack_ffffffffffffe978);
          bVar3 = jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::
                  contains(in_stack_ffffffffffffe9b8,in_stack_ffffffffffffe9b0);
          if (bVar3) {
            std::operator<<((ostream *)&std::cout,"\n");
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffe980
                       ,(char *)in_stack_ffffffffffffe978);
            jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::operator[]
                      (in_stack_ffffffffffffe9a8,(string_view_type *)in_stack_ffffffffffffe9a0);
            pbVar7 = jsoncons::operator<<
                               (in_stack_ffffffffffffeae0,
                                (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                                in_stack_ffffffffffffead8);
            std::operator<<(pbVar7,"\n");
          }
          std::operator<<((ostream *)&std::cout,"Input:\n");
          jsoncons::
          pretty_print<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
                    ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                     CONCAT44(in_stack_ffffffffffffe96c,in_stack_ffffffffffffe968));
          pbVar7 = jsoncons::operator<<
                             ((basic_ostream<char,_std::char_traits<char>_> *)
                              in_stack_ffffffffffffe970,
                              (json_printable<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                               *)CONCAT44(in_stack_ffffffffffffe96c,in_stack_ffffffffffffe968));
          std::operator<<(pbVar7,"\n\n");
          jsoncons::
          json_printable<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
          ::~json_printable((json_printable<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                             *)0x70d85b);
          poVar6 = std::operator<<((ostream *)&std::cout,"Expression: ");
          poVar6 = std::operator<<(poVar6,local_428);
          std::operator<<(poVar6,"\n\n");
          in_stack_ffffffffffffeb78 =
               (jsonpath_expression<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
                *)std::operator<<((ostream *)&std::cout,"Actual: ");
          jsoncons::
          pretty_print<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
                    ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                     CONCAT44(in_stack_ffffffffffffe96c,in_stack_ffffffffffffe968));
          in_stack_ffffffffffffeb70 =
               jsoncons::operator<<
                         ((basic_ostream<char,_std::char_traits<char>_> *)in_stack_ffffffffffffe970,
                          (json_printable<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                           *)CONCAT44(in_stack_ffffffffffffe96c,in_stack_ffffffffffffe968));
          std::operator<<(in_stack_ffffffffffffeb70,"\n\n");
          jsoncons::
          json_printable<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
          ::~json_printable((json_printable<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                             *)0x70d923);
          in_stack_ffffffffffffeb68 = std::operator<<((ostream *)&std::cout,"Expected: ");
          jsoncons::
          pretty_print<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
                    ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                     CONCAT44(in_stack_ffffffffffffe96c,in_stack_ffffffffffffe968));
          pbVar7 = jsoncons::operator<<
                             ((basic_ostream<char,_std::char_traits<char>_> *)
                              in_stack_ffffffffffffe970,
                              (json_printable<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                               *)CONCAT44(in_stack_ffffffffffffe96c,in_stack_ffffffffffffe968));
          std::operator<<(pbVar7,"\n\n");
          jsoncons::
          json_printable<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
          ::~json_printable((json_printable<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                             *)0x70d999);
        }
        local_918 = operator____catch_sr
                              ((char *)in_stack_ffffffffffffe970,
                               CONCAT44(in_stack_ffffffffffffe96c,in_stack_ffffffffffffe968));
        Catch::SourceLineInfo::SourceLineInfo
                  (&local_928,
                   "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/jsonpath/src/jsonpath_test_suite.cpp"
                   ,0x49);
        Catch::StringRef::StringRef
                  ((StringRef *)in_stack_ffffffffffffe980,(char *)in_stack_ffffffffffffe978);
        Catch::AssertionHandler::AssertionHandler
                  (in_stack_ffffffffffffe980,in_stack_ffffffffffffe978,
                   (SourceLineInfo *)in_stack_ffffffffffffe970,in_stack_ffffffffffffe988,
                   in_stack_ffffffffffffe96c);
        local_970 = (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                    Catch::Decomposer::operator<=
                              ((Decomposer *)
                               CONCAT44(in_stack_ffffffffffffe96c,in_stack_ffffffffffffe968),
                               (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                               0x70daaf);
        Catch::
        ExprLhs<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&>::
        operator==((ExprLhs<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
                    *)in_stack_ffffffffffffe9a8,
                   (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                   in_stack_ffffffffffffe9a0);
        Catch::AssertionHandler::handleExpr
                  (in_stack_ffffffffffffe970,
                   (ITransientExpression *)
                   CONCAT44(in_stack_ffffffffffffe96c,in_stack_ffffffffffffe968));
        Catch::
        BinaryExpr<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
        ::~BinaryExpr((BinaryExpr<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
                       *)0x70db0c);
        Catch::AssertionHandler::complete(in_stack_ffffffffffffe970);
        Catch::AssertionHandler::~AssertionHandler(in_stack_ffffffffffffe970);
        jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::~basic_json
                  ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)0x70db95);
      }
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffe980,
                 (char *)in_stack_ffffffffffffe978);
      bVar3 = jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::contains
                        (in_stack_ffffffffffffe9b8,in_stack_ffffffffffffe9b0);
      if (bVar3) {
        local_98c = jsoncons::jsonpath::operator|(local_43c,path);
        jsoncons::jsonpath::
        jsonpath_expression<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
        ::evaluate(in_stack_ffffffffffffeb78,(const_reference)in_stack_ffffffffffffeb70,
                   (result_options)((ulong)in_stack_ffffffffffffeb68 >> 0x20));
        in_stack_ffffffffffffeb28 = local_408;
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffe980,
                   (char *)in_stack_ffffffffffffe978);
        local_9a8 = jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::
                    operator[](in_stack_ffffffffffffe9a8,
                               (string_view_type *)in_stack_ffffffffffffe9a0);
        tVar4 = jsoncons::operator!=
                          ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                           in_stack_ffffffffffffe970,
                           (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                           CONCAT44(in_stack_ffffffffffffe96c,in_stack_ffffffffffffe968));
        if (tVar4) {
          in_stack_ffffffffffffeb20 = local_408;
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffe980,
                     (char *)in_stack_ffffffffffffe978);
          bVar3 = jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::
                  contains(in_stack_ffffffffffffe9b8,in_stack_ffffffffffffe9b0);
          if (bVar3) {
            std::operator<<((ostream *)&std::cout,"\n");
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffe980
                       ,(char *)in_stack_ffffffffffffe978);
            jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::operator[]
                      (in_stack_ffffffffffffe9a8,(string_view_type *)in_stack_ffffffffffffe9a0);
            pbVar7 = jsoncons::operator<<
                               (in_stack_ffffffffffffeae0,
                                (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                                in_stack_ffffffffffffead8);
            std::operator<<(pbVar7,"\n");
          }
          std::operator<<((ostream *)&std::cout,"Input:\n");
          jsoncons::
          pretty_print<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
                    ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                     CONCAT44(in_stack_ffffffffffffe96c,in_stack_ffffffffffffe968));
          pbVar7 = jsoncons::operator<<
                             ((basic_ostream<char,_std::char_traits<char>_> *)
                              in_stack_ffffffffffffe970,
                              (json_printable<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                               *)CONCAT44(in_stack_ffffffffffffe96c,in_stack_ffffffffffffe968));
          std::operator<<(pbVar7,"\n\n");
          jsoncons::
          json_printable<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
          ::~json_printable((json_printable<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                             *)0x70de62);
          in_stack_ffffffffffffeae0 = std::operator<<((ostream *)&std::cout,"Expression: ");
          in_stack_ffffffffffffead8 = std::operator<<(in_stack_ffffffffffffeae0,local_428);
          std::operator<<(in_stack_ffffffffffffead8,"\n\n");
          std::operator<<((ostream *)&std::cout,"Actual: ");
          jsoncons::
          pretty_print<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
                    ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                     CONCAT44(in_stack_ffffffffffffe96c,in_stack_ffffffffffffe968));
          pbVar7 = jsoncons::operator<<
                             ((basic_ostream<char,_std::char_traits<char>_> *)
                              in_stack_ffffffffffffe970,
                              (json_printable<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                               *)CONCAT44(in_stack_ffffffffffffe96c,in_stack_ffffffffffffe968));
          std::operator<<(pbVar7,"\n\n");
          jsoncons::
          json_printable<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
          ::~json_printable((json_printable<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                             *)0x70df2a);
          std::operator<<((ostream *)&std::cout,"Expected: ");
          jsoncons::
          pretty_print<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
                    ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                     CONCAT44(in_stack_ffffffffffffe96c,in_stack_ffffffffffffe968));
          pbVar7 = jsoncons::operator<<
                             ((basic_ostream<char,_std::char_traits<char>_> *)
                              in_stack_ffffffffffffe970,
                              (json_printable<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                               *)CONCAT44(in_stack_ffffffffffffe96c,in_stack_ffffffffffffe968));
          std::operator<<(pbVar7,"\n\n");
          jsoncons::
          json_printable<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
          ::~json_printable((json_printable<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                             *)0x70dfa0);
        }
        local_da8 = operator____catch_sr
                              ((char *)in_stack_ffffffffffffe970,
                               CONCAT44(in_stack_ffffffffffffe96c,in_stack_ffffffffffffe968));
        Catch::SourceLineInfo::SourceLineInfo
                  (&local_db8,
                   "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/jsonpath/src/jsonpath_test_suite.cpp"
                   ,0x5c);
        Catch::StringRef::StringRef
                  ((StringRef *)in_stack_ffffffffffffe980,(char *)in_stack_ffffffffffffe978);
        Catch::AssertionHandler::AssertionHandler
                  (in_stack_ffffffffffffe980,in_stack_ffffffffffffe978,
                   (SourceLineInfo *)in_stack_ffffffffffffe970,in_stack_ffffffffffffe988,
                   in_stack_ffffffffffffe96c);
        local_e00 = (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                    Catch::Decomposer::operator<=
                              ((Decomposer *)
                               CONCAT44(in_stack_ffffffffffffe96c,in_stack_ffffffffffffe968),
                               (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                               0x70e0b6);
        Catch::
        ExprLhs<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&>::
        operator==((ExprLhs<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
                    *)in_stack_ffffffffffffe9a8,
                   (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                   in_stack_ffffffffffffe9a0);
        Catch::AssertionHandler::handleExpr
                  (in_stack_ffffffffffffe970,
                   (ITransientExpression *)
                   CONCAT44(in_stack_ffffffffffffe96c,in_stack_ffffffffffffe968));
        Catch::
        BinaryExpr<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
        ::~BinaryExpr((BinaryExpr<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
                       *)0x70e113);
        Catch::AssertionHandler::complete(in_stack_ffffffffffffe970);
        Catch::AssertionHandler::~AssertionHandler(in_stack_ffffffffffffe970);
        jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::~basic_json
                  ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)0x70e19c);
      }
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffe980,
                 (char *)in_stack_ffffffffffffe978);
      bVar3 = jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::contains
                        (in_stack_ffffffffffffe9b8,in_stack_ffffffffffffe9b0);
      if (bVar3) {
        jsoncons::jsonpath::
        jsonpath_expression<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
        ::evaluate(in_stack_ffffffffffffeb78,(const_reference)in_stack_ffffffffffffeb70,
                   (result_options)((ulong)in_stack_ffffffffffffeb68 >> 0x20));
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffe980,
                   (char *)in_stack_ffffffffffffe978);
        bVar3 = jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::contains
                          (in_stack_ffffffffffffe9b8,in_stack_ffffffffffffe9b0);
        if (bVar3) {
          std::operator<<((ostream *)&std::cout,"Comment: ");
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffe980,
                     (char *)in_stack_ffffffffffffe978);
          jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::operator[]
                    (in_stack_ffffffffffffe9a8,(string_view_type *)in_stack_ffffffffffffe9a0);
          pbVar7 = jsoncons::operator<<
                             (in_stack_ffffffffffffeae0,
                              (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                              in_stack_ffffffffffffead8);
          std::operator<<(pbVar7,"\n");
        }
        std::operator<<((ostream *)&std::cout,"Error: ");
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffe980,
                   (char *)in_stack_ffffffffffffe978);
        jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::operator[]
                  (in_stack_ffffffffffffe9a8,(string_view_type *)in_stack_ffffffffffffe9a0);
        pbVar7 = jsoncons::operator<<
                           (in_stack_ffffffffffffeae0,
                            (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                            in_stack_ffffffffffffead8);
        std::operator<<(pbVar7,"\n\n");
        std::operator<<((ostream *)&std::cout,"Input:\n");
        jsoncons::
        pretty_print<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
                  ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                   CONCAT44(in_stack_ffffffffffffe96c,in_stack_ffffffffffffe968));
        pbVar7 = jsoncons::operator<<
                           ((basic_ostream<char,_std::char_traits<char>_> *)
                            in_stack_ffffffffffffe970,
                            (json_printable<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                             *)CONCAT44(in_stack_ffffffffffffe96c,in_stack_ffffffffffffe968));
        std::operator<<(pbVar7,"\n\n");
        jsoncons::
        json_printable<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
        ::~json_printable((json_printable<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                           *)0x70e460);
        poVar6 = std::operator<<((ostream *)&std::cout,"Expression: ");
        poVar6 = std::operator<<(poVar6,local_428);
        std::operator<<(poVar6,"\n\n");
        std::operator<<((ostream *)&std::cout,"Actual: ");
        jsoncons::
        pretty_print<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
                  ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                   CONCAT44(in_stack_ffffffffffffe96c,in_stack_ffffffffffffe968));
        pbVar7 = jsoncons::operator<<
                           ((basic_ostream<char,_std::char_traits<char>_> *)
                            in_stack_ffffffffffffe970,
                            (json_printable<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                             *)CONCAT44(in_stack_ffffffffffffe96c,in_stack_ffffffffffffe968));
        std::operator<<(pbVar7,"\n\n");
        jsoncons::
        json_printable<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
        ::~json_printable((json_printable<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                           *)0x70e528);
        local_1100 = operator____catch_sr
                               ((char *)in_stack_ffffffffffffe970,
                                CONCAT44(in_stack_ffffffffffffe96c,in_stack_ffffffffffffe968));
        Catch::SourceLineInfo::SourceLineInfo
                  (&local_1110,
                   "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/jsonpath/src/jsonpath_test_suite.cpp"
                   ,0x69);
        Catch::StringRef::StringRef
                  ((StringRef *)in_stack_ffffffffffffe980,(char *)in_stack_ffffffffffffe978);
        Catch::AssertionHandler::AssertionHandler
                  (in_stack_ffffffffffffe980,in_stack_ffffffffffffe978,
                   (SourceLineInfo *)in_stack_ffffffffffffe970,in_stack_ffffffffffffe988,
                   in_stack_ffffffffffffe96c);
        Catch::Decomposer::operator<=
                  ((Decomposer *)CONCAT44(in_stack_ffffffffffffe96c,in_stack_ffffffffffffe968),false
                  );
        Catch::AssertionHandler::handleExpr<bool>
                  (in_stack_ffffffffffffe9a0,in_stack_ffffffffffffe998);
        Catch::AssertionHandler::complete(in_stack_ffffffffffffe970);
        Catch::AssertionHandler::~AssertionHandler(in_stack_ffffffffffffe970);
        jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::~basic_json
                  ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)0x70e6a5);
      }
      jsoncons::jsonpath::
      jsonpath_expression<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
      ::~jsonpath_expression
                ((jsonpath_expression<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
                  *)in_stack_ffffffffffffe970);
      std::__cxx11::string::~string(local_428);
      __gnu_cxx::
      __normal_iterator<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
      ::operator++(local_3f8);
    }
    __gnu_cxx::
    __normal_iterator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
    ::operator++(&local_3a0);
  }
  jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::~basic_json
            ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)0x70ec13);
  std::fstream::~fstream(local_218);
  return;
}

Assistant:

void jsonpath_tests(const std::string& fpath)
{
    std::cout << "Test " << fpath << '\n';

    std::fstream is(fpath);
    if (!is)
    {
        std::cerr << "Cannot open " << fpath << "\n";
        exit(1);
    }

    json tests = json::parse(is);
    for (const auto& test_group : tests.array_range())
    {
        const json& instance = test_group["given"];

        for (const auto& test_case : test_group["cases"].array_range())
        {
            std::string expr = test_case["expression"].as<std::string>();
            try
            {
                jsonpath::result_options options = jsonpath::result_options();
                if (test_case.contains("nodups") && test_case.at("nodups").as<bool>())
                {
                    options |= jsonpath::result_options::nodups;
                }
                if (test_case.contains("sort") && test_case.at("sort").as<bool>())
                {
                    options |= jsonpath::result_options::sort;
                }
                auto expression = jsoncons::jsonpath::make_expression<json>(expr);
                if (test_case.contains("result"))
                {
                    jsonpath::result_options rflags = options | jsonpath::result_options::value;
                    json actual = expression.evaluate(instance, rflags);
                    const json& expected = test_case["result"];
                    //std::cout << "actual\n:" << actual << "\n";
                    if (actual != expected)
                    {
                        if (test_case.contains("comment"))
                        {
                            std::cout << "\n" << test_case["comment"] << "\n";
                        }
                        std::cout << "Input:\n" << pretty_print(instance) << "\n\n";
                        std::cout << "Expression: " << expr << "\n\n";
                        std::cout << "Actual: " << pretty_print(actual) << "\n\n";
                        std::cout << "Expected: " << pretty_print(expected) << "\n\n";
                    }
                    CHECK(expected == actual);
                }
                if (test_case.contains("path"))
                {
                    jsonpath::result_options pflags = options | jsonpath::result_options::path;
                    json actual = expression.evaluate(instance, pflags);
                    const json& expected = test_case["path"];
                    //std::cout << "actual\n:" << actual << "\n";
                    if (actual != expected)
                    {
                        if (test_case.contains("comment"))
                        {
                            std::cout << "\n" << test_case["comment"] << "\n";
                        }
                        std::cout << "Input:\n" << pretty_print(instance) << "\n\n";
                        std::cout << "Expression: " << expr << "\n\n";
                        std::cout << "Actual: " << pretty_print(actual) << "\n\n";
                        std::cout << "Expected: " << pretty_print(expected) << "\n\n";
                    }
                    CHECK(expected == actual);
                }
                if (test_case.contains("error"))
                {
                    json actual = expression.evaluate(instance);
                    if (test_case.contains("comment"))
                    {
                        std::cout << "Comment: " << test_case["comment"] << "\n";
                    }
                    std::cout << "Error: " << test_case["error"] << "\n\n";
                    std::cout << "Input:\n" << pretty_print(instance) << "\n\n";
                    std::cout << "Expression: " << expr << "\n\n";
                    std::cout << "Actual: " << pretty_print(actual) << "\n\n";
                    CHECK(false);
                }

            }
            catch (const std::exception& e)
            {
                if (test_case.contains("result"))
                {
                    std::cout << e.what() << "\n";
                    const json& expected = test_case["result"];
                    std::cout << e.what() << "\n";
                    if (test_case.contains("comment"))
                    {
                        std::cout << "Comment: " << test_case["comment"] << "\n\n";
                    }
                    std::cout << "Input\n" << pretty_print(instance) << "\n\n";
                    std::cout << "Expression: " << expr << "\n\n";
                    std::cout << "Expected: " << expected << "\n\n";
                    CHECK(false);
                }
            }
        }
    }
}